

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
* __thiscall
testing::internal::DoAllAction::operator_cast_to_Action
          (Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
           *__return_storage_ptr__,DoAllAction *this)

{
  ReturnAction *this_00;
  Op local_50;
  DoAllAction *local_18;
  DoAllAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:206:36),_testing::internal::ReturnAction<ot::commissioner::Error>_>
  *this_local;
  
  local_18 = this;
  this_local = (DoAllAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:206:36),_testing::internal::ReturnAction<ot::commissioner::Error>_>
                *)__return_storage_ptr__;
  DoAllAction<JobManagerTestSuite_StartStopSuccess_Test::TestBody()::$_1,testing::internal::ReturnAction<ot::commissioner::Error>>
  ::
  Convert<testing::Action<void(std::__cxx11::string&,std::__cxx11::string_const&,unsigned_short)>,0ul>
            ();
  this_00 = (ReturnAction *)
            std::
            get<1ul,JobManagerTestSuite_StartStopSuccess_Test::TestBody()::__1,testing::internal::ReturnAction<ot::commissioner::Error>>
                      ((tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:206:36),_testing::internal::ReturnAction<ot::commissioner::Error>_>
                        *)this);
  ReturnAction::operator_cast_to_Action(&local_50.last,this_00);
  testing::Action::Action(testing::internal::DoAllAction::operator_cast_to_Action
            ((DoAllAction *)__return_storage_ptr__,&local_50);
  DoAllAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:206:36),_testing::internal::ReturnAction<ot::commissioner::Error>_>
  ::
  operator_Action<ot::commissioner::Error,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short>
  ::Op::~Op(&local_50);
  return __return_storage_ptr__;
}

Assistant:

operator Action<R(Args...)>() const {  // NOLINT
    struct Op {
      std::vector<Action<void(NonFinalType<Args>...)>> converted;
      Action<R(Args...)> last;
      R operator()(Args... args) const {
        auto tuple_args = std::forward_as_tuple(std::forward<Args>(args)...);
        for (auto& a : converted) {
          a.Perform(tuple_args);
        }
        return last.Perform(std::move(tuple_args));
      }
    };
    return Op{Convert<Action<void(NonFinalType<Args>...)>>(
                  MakeIndexSequence<sizeof...(Actions) - 1>()),
              std::get<sizeof...(Actions) - 1>(actions)};
  }